

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

token_data * __thiscall llama_vocab::get_token_data(llama_vocab *this,llama_token id)

{
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  _Var1._M_head_impl =
       (this->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->type == LLAMA_VOCAB_TYPE_NONE) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0xb33,"GGML_ASSERT(%s) failed","pimpl->type != LLAMA_VOCAB_TYPE_NONE");
  }
  uVar4 = (ulong)id;
  lVar2 = *(long *)&((_Var1._M_head_impl)->id_to_token).
                    super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
  ;
  uVar3 = ((long)*(pointer *)((long)&(_Var1._M_head_impl)->id_to_token + 8) - lVar2 >> 3) *
          -0x3333333333333333;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    return (token_data *)(lVar2 + uVar4 * 0x28);
  }
  ::std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const llama_vocab::token_data & llama_vocab::get_token_data(llama_token id) const {
    GGML_ASSERT(pimpl->type != LLAMA_VOCAB_TYPE_NONE);
    return pimpl->id_to_token.at(id);
}